

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O3

int ConvolutionReverb::GetFloatParameterCallback
              (UnityAudioEffectState *state,int index,float *value,char *valuestr)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = (state->field_0).field_0.effectdata;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,
                  "T *UnityAudioEffectState::GetEffectData() const [T = ConvolutionReverb::EffectData]"
                 );
  }
  if ((state->field_0).field_0.internal != (void *)0x0) {
    iVar2 = 1;
    if (index < 0xb) {
      if (value != (float *)0x0) {
        *value = *(float *)((long)pvVar1 + (long)index * 4 + 8);
      }
      iVar2 = 0;
      if (valuestr != (char *)0x0) {
        *valuestr = '\0';
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  __assert_fail("internal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                ,0xfe,
                "T *UnityAudioEffectState::GetEffectData() const [T = ConvolutionReverb::EffectData]"
               );
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK GetFloatParameterCallback(UnityAudioEffectState* state, int index, float* value, char *valuestr)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        if (value != NULL)
            *value = data->p[index];
        if (valuestr != NULL)
            valuestr[0] = 0;
        return UNITY_AUDIODSP_OK;
    }